

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qemulationpaintengine.cpp
# Opt level: O1

void __thiscall QEmulationPaintEngine::fillBGRect(QEmulationPaintEngine *this,QRectF *r)

{
  QPaintEngineState *pQVar1;
  QPaintEngineState *pQVar2;
  long in_FS_OFFSET;
  QVectorPath local_98;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.m_points = &local_58;
  local_58 = r->xp;
  dStack_50 = r->yp;
  local_38 = local_58 + r->w;
  dStack_30 = dStack_50 + r->h;
  local_48 = local_58 + r->w;
  local_98.m_cp_rect.x1._0_4_ = 0xffffffff;
  local_98.m_cp_rect.x1._4_4_ = 0xffffffff;
  local_98.m_cp_rect.y1._0_4_ = 0xffffffff;
  local_98.m_cp_rect.y1._4_4_ = 0xffffffff;
  local_98.m_cp_rect.x2._0_4_ = 0xffffffff;
  local_98.m_cp_rect.x2._4_4_ = 0xffffffff;
  local_98.m_cp_rect.y2._0_4_ = 0xffffffff;
  local_98.m_cp_rect.y2._4_4_ = 0xffffffff;
  local_98.m_cache = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.m_elements = (ElementType *)0x0;
  local_98.m_count = 4;
  local_98.m_hints = 0x11;
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar2 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar2 = (QPaintEngineState *)0x0;
  }
  dStack_40 = dStack_50;
  local_28 = local_58;
  dStack_20 = dStack_30;
  (*(this->real_engine->super_QPaintEngine)._vptr_QPaintEngine[0x1a])
            (this->real_engine,&local_98,pQVar2 + 0x14);
  QVectorPath::~QVectorPath(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEmulationPaintEngine::fillBGRect(const QRectF &r)
{
    qreal pts[] = { r.x(), r.y(), r.x() + r.width(), r.y(),
                    r.x() + r.width(), r.y() + r.height(), r.x(), r.y() + r.height() };
    QVectorPath vp(pts, 4, nullptr, QVectorPath::RectangleHint);
    real_engine->fill(vp, state()->bgBrush);
}